

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

SubDFriendlyKnotType
ON_SubD::NurbsKnotType(int order,int cv_count,double *knots,ON_SimpleArray<double> *triple_knots)

{
  uint uVar1;
  double dVar2;
  bool bVar3;
  SubDFriendlyKnotType SVar4;
  int iVar5;
  bool bVar7;
  bool bVar8;
  char cVar9;
  SubDFriendlyKnotType SVar10;
  byte bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iVar6;
  
  if ((triple_knots != (ON_SimpleArray<double> *)0x0) && (-1 < triple_knots->m_capacity)) {
    triple_knots->m_count = 0;
  }
  SVar4 = Unfriendly;
  if ((order == 4) && (knots != (double *)0x0 && 3 < cv_count)) {
    dVar14 = knots[3] - knots[2];
    if (0.0 < dVar14) {
      bVar11 = -(*knots == knots[1]) & -(knots[2] == knots[1]);
      uVar1 = cv_count - 1;
      dVar13 = knots[(uint)cv_count];
      if ((knots[uVar1] != dVar13) || (NAN(knots[uVar1]) || NAN(dVar13))) {
        bVar7 = false;
      }
      else {
        bVar7 = dVar13 == knots[(ulong)(uint)cv_count + 1];
      }
      if ((~bVar11 & 1) == 0 && triple_knots != (ON_SimpleArray<double> *)0x0) {
        ON_SimpleArray<double>::Append(triple_knots,knots + 2);
      }
      dVar13 = dVar14 * 1.490116119385e-08;
      bVar8 = (bool)(bVar11 & bVar7);
      bVar3 = false;
      if ((((bVar8 == false) && (ABS((knots[1] - *knots) - dVar14) <= dVar13)) &&
          (ABS((knots[2] - knots[1]) - dVar14) <= dVar13)) &&
         (ABS((knots[(uint)cv_count] - knots[uVar1]) - dVar14) <= dVar13)) {
        bVar3 = ABS((knots[(ulong)(uint)cv_count + 1] - knots[(uint)cv_count]) - dVar14) <= dVar13;
      }
      if (bVar3 != bVar8) {
        SVar10 = ClampedUniform;
        if (4 < (uint)cv_count) {
          iVar5 = 3;
          cVar9 = '\0';
          do {
            dVar2 = knots[iVar5];
            dVar12 = knots[(long)iVar5 + 1] - dVar2;
            if ((dVar12 != 0.0) || (NAN(dVar12))) {
              iVar6 = iVar5;
              if (dVar13 < ABS(dVar12 - dVar14)) {
                return Unfriendly;
              }
            }
            else {
              if (bVar8 == false) {
                return Unfriendly;
              }
              if (knots[(long)iVar5 + 2] != dVar2) {
                return Unfriendly;
              }
              if (NAN(knots[(long)iVar5 + 2]) || NAN(dVar2)) {
                return Unfriendly;
              }
              cVar9 = '\x01';
              iVar6 = iVar5 + 1;
              if (triple_knots != (ON_SimpleArray<double> *)0x0) {
                ON_SimpleArray<double>::Append(triple_knots,knots + (long)iVar5 + 1);
              }
            }
            iVar5 = iVar6 + 1;
          } while (iVar5 < (int)uVar1);
          SVar10 = cVar9 * '\x02' + ClampedUniform;
        }
        if (bVar7 == true && triple_knots != (ON_SimpleArray<double> *)0x0) {
          ON_SimpleArray<double>::Append(triple_knots,knots + uVar1);
        }
        SVar4 = UnclampedUniform;
        if (bVar8 != false) {
          SVar4 = SVar10;
        }
      }
    }
  }
  return SVar4;
}

Assistant:

ON_SubD::SubDFriendlyKnotType ON_SubD::NurbsKnotType(
    int order,
    int cv_count,
    const double* knots,
    ON_SimpleArray<double>* triple_knots
  )
{
  if (nullptr != triple_knots)
    triple_knots->SetCount(0);
  for (;;)
  {
    if (4 != order || cv_count < order || nullptr == knots)
      break;

    const double delta = knots[3] - knots[2];
    if (false == (delta > 0.0))
      break;

    const double deltatol = ON_SQRT_EPSILON * delta;

    const bool bClamped0 = knots[0] == knots[1] && knots[1] == knots[2];
    const bool bClamped1 = knots[cv_count - 1] == knots[cv_count] && knots[cv_count] == knots[cv_count + 1];
    if (bClamped0 && nullptr != triple_knots)
      triple_knots->Append(knots[2]);

    const bool bClamped = bClamped0 && bClamped1;
    const bool bUnclamped =
      (false == bClamped)
      && fabs(knots[1] - knots[0] - delta) <= deltatol
      && fabs(knots[2] - knots[1] - delta) <= deltatol
      && fabs(knots[cv_count] - knots[cv_count - 1] - delta) <= deltatol
      && fabs(knots[cv_count + 1] - knots[cv_count] - delta) <= deltatol
      ;
    if ( bClamped == bUnclamped)
      break;

    bool bPiecewiseUniform = false;
    for (int knot_dex = 3; knot_dex < cv_count - 1; ++knot_dex)
    {
      const double d = knots[knot_dex + 1] - knots[knot_dex];
      if (0.0 == d)
      {
        if (bClamped && knots[knot_dex + 2] == knots[knot_dex])
        {
          bPiecewiseUniform = true;
          ++knot_dex;
          if (bClamped1 && nullptr != triple_knots)
            triple_knots->Append(knots[knot_dex]);
          continue;
        }
      }
      else
      {
        if (fabs(d - delta) <= deltatol)
          continue;
      }
      return ON_SubD::SubDFriendlyKnotType::Unfriendly;
    }

    if (bClamped1 && nullptr != triple_knots)
      triple_knots->Append(knots[cv_count - 1]);

    return
      bClamped
      ? (bPiecewiseUniform ? ON_SubD::SubDFriendlyKnotType::ClampedPiecewiseUniform : ON_SubD::SubDFriendlyKnotType::ClampedUniform)
      : ON_SubD::SubDFriendlyKnotType::UnclampedUniform;
  }

  return ON_SubD::SubDFriendlyKnotType::Unfriendly;
}